

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall webrtc::Histogram::RemoveOldestEntryAndUpdate(Histogram *this)

{
  int iVar1;
  type piVar2;
  int oldest_hist_index;
  int oldest_prob;
  Histogram *this_local;
  
  if (this->len_circular_buffer_ < 1) {
    __assert_fail("len_circular_buffer_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/histogram.cc"
                  ,0x68,"void webrtc::Histogram::RemoveOldestEntryAndUpdate()");
  }
  if (this->buffer_is_full_ != 0) {
    piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->activity_probability_,(long)this->buffer_index_);
    iVar1 = *piVar2;
    piVar2 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->hist_bin_index_,(long)this->buffer_index_);
    UpdateHist(this,-iVar1,*piVar2);
  }
  return;
}

Assistant:

void Histogram::RemoveOldestEntryAndUpdate() {
  assert(len_circular_buffer_ > 0);
  // Do nothing if circular buffer is not full.
  if (!buffer_is_full_)
    return;

  int oldest_prob = activity_probability_[buffer_index_];
  int oldest_hist_index = hist_bin_index_[buffer_index_];
  UpdateHist(-oldest_prob, oldest_hist_index);
}